

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::WaitSemaphores
          (VulkanLogicalDevice *this,VkSemaphoreWaitInfo *WaitInfo,uint64_t Timeout)

{
  VkResult VVar1;
  Char *Message;
  char (*in_RCX) [56];
  undefined1 local_40 [8];
  string msg;
  uint64_t Timeout_local;
  VkSemaphoreWaitInfo *WaitInfo_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = Timeout;
  if (WaitInfo->sType != VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO) {
    Diligent::FormatString<char[26],char[56]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"WaitInfo.sType == VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"WaitSemaphores",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x2ae);
    std::__cxx11::string::~string((string *)local_40);
  }
  VVar1 = (*vkWaitSemaphoresKHR)(this->m_VkDevice,WaitInfo,msg.field_2._8_8_);
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::WaitSemaphores(const VkSemaphoreWaitInfo& WaitInfo, uint64_t Timeout) const
{
#if DILIGENT_USE_VOLK
    VERIFY_EXPR(WaitInfo.sType == VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO);
    return vkWaitSemaphoresKHR(m_VkDevice, &WaitInfo, Timeout);
#else
    UNSUPPORTED("vkWaitSemaphoresKHR is only available through Volk");
    return VK_ERROR_FEATURE_NOT_PRESENT;
#endif
}